

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O2

M44f * anon_unknown.dwarf_47fb2::matrixEulerMatrix_1
                 (M44f *__return_storage_ptr__,M44f *M,Order order)

{
  V3f f;
  Euler<float> local_28;
  
  if (order == Default) {
    Imath_2_5::extractEulerXYZ<float>(M,&f);
  }
  else {
    Imath_2_5::extractEulerZYX<float>(M,&f);
  }
  Imath_2_5::Euler<float>::Euler(&local_28,&f,order,IJKLayout);
  Imath_2_5::Euler<float>::toMatrix44(__return_storage_ptr__,&local_28);
  return __return_storage_ptr__;
}

Assistant:

M44f
matrixEulerMatrix_1 (const M44f &M, Eulerf::Order order)
{
    V3f f;

    if (order == Eulerf::XYZ)
	extractEulerXYZ (M, f);
    else
	extractEulerZYX (M, f);

    return Eulerf(f, order).toMatrix44();
}